

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnector.cpp
# Opt level: O2

void __thiscall hwnet::TCPConnector::OnActive(TCPConnector *this,int _)

{
  mutex *__mutex;
  Poller *pPVar1;
  bool bVar2;
  element_type *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_48;
  undefined1 auStack_40 [8];
  shared_ptr<hwnet::util::Timer> p;
  
  bVar2 = checkError(this);
  this->gotError = bVar2;
  pPVar1 = this->poller_;
  std::__shared_ptr<hwnet::TCPConnector,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<hwnet::TCPConnector,void>
            ((__shared_ptr<hwnet::TCPConnector,(__gnu_cxx::_Lock_policy)2> *)&local_50,
             (__weak_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<hwnet::TCPConnector>);
  auStack_40 = (undefined1  [8])local_50;
  if (local_50 != (Timer *)0x0) {
    auStack_40 = (undefined1  [8])
                 &(local_50->super_enable_shared_from_this<hwnet::util::Timer>)._M_weak_this.
                  super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  }
  p.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Stack_48._M_pi;
  local_50 = (element_type *)0x0;
  _Stack_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Poller::Remove(pPVar1,(Ptr *)auStack_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48);
  std::__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)auStack_40,
             &this->connectTimer);
  if (auStack_40 != (undefined1  [8])0x0) {
    util::Timer::cancel((Timer *)auStack_40);
    std::__weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->connectTimer).
                super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p);
  __mutex = &this->mtx;
  std::mutex::lock(__mutex);
  if (this->doing == false) {
    this->doing = true;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    pPVar1 = this->poller_;
    std::__shared_ptr<hwnet::TCPConnector,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<hwnet::TCPConnector,void>
              ((__shared_ptr<hwnet::TCPConnector,(__gnu_cxx::_Lock_policy)2> *)&local_50,
               (__weak_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<hwnet::TCPConnector>);
    auStack_40 = (undefined1  [8])local_50;
    p.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Stack_48._M_pi;
    local_50 = (element_type *)0x0;
    _Stack_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Poller::PostTask(pPVar1,(Ptr *)auStack_40,(ThreadPool *)0x0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48);
  }
  else {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return;
}

Assistant:

void TCPConnector::OnActive(int _) {
	(void)_;	

	this->gotError = this->checkError();

	this->poller_->Remove(shared_from_this());

	
	if(auto p = this->connectTimer.lock()) {
		p->cancel();
		this->connectTimer.reset();
	}
	
	auto post = false;
	this->mtx.lock();
	if(!this->doing) {
		post = true;
		this->doing = true;
	}
	this->mtx.unlock();

	if(post) {
		poller_->PostTask(shared_from_this());
	}
}